

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
FxExpression::EmitCompare
          (FxExpression *this,VMFunctionBuilder *build,bool invert,
          TArray<unsigned_long,_unsigned_long> *patchspots_yes,
          TArray<unsigned_long,_unsigned_long> *patchspots_no)

{
  ExpEmit EVar1;
  uint uVar2;
  uint uVar3;
  undefined4 extraout_var;
  byte local_51;
  size_t local_50;
  ExpEmit local_48;
  ExpEmit local_40;
  ExpEmit i;
  ExpEmit op;
  TArray<unsigned_long,_unsigned_long> *patchspots_no_local;
  TArray<unsigned_long,_unsigned_long> *patchspots_yes_local;
  bool invert_local;
  VMFunctionBuilder *build_local;
  FxExpression *this_local;
  
  i._0_4_ = (*this->_vptr_FxExpression[9])();
  i.Konst = (bool)(char)extraout_var;
  i.Fixed = (bool)(char)((uint)extraout_var >> 8);
  i.Final = (bool)(char)((uint)extraout_var >> 0x10);
  i.Target = (bool)(char)((uint)extraout_var >> 0x18);
  ExpEmit::ExpEmit(&local_40);
  local_51 = 0;
  if (i.RegType != 0x80) {
    local_51 = 0;
    if (i.RegCount == '\x01') {
      local_51 = i.Konst ^ 0xff;
    }
  }
  if ((local_51 & 1) != 0) {
    switch(i.RegType) {
    case '\0':
      uVar2 = (uint)i.RegNum;
      uVar3 = VMFunctionBuilder::GetConstantInt(build,0);
      VMFunctionBuilder::Emit(build,0x8a,(uint)((invert ^ 0xffU) & 1),uVar2,uVar3);
      break;
    case '\x01':
      uVar2 = (uint)i.RegNum;
      uVar3 = VMFunctionBuilder::GetConstantFloat(build,0.0);
      VMFunctionBuilder::Emit(build,0xae,(uint)((invert ^ 0xffU) & 1),uVar2,uVar3);
      break;
    case '\x02':
      ExpEmit::ExpEmit(&local_48,build,0,1);
      local_40 = local_48;
      EVar1 = local_40;
      local_40.RegNum = local_48.RegNum;
      uVar2 = (uint)local_40.RegNum;
      local_40 = EVar1;
      VMFunctionBuilder::Emit(build,0x58,uVar2,i.RegNum);
      uVar2 = (uint)local_40.RegNum;
      uVar3 = VMFunctionBuilder::GetConstantInt(build,0);
      VMFunctionBuilder::Emit(build,0x8a,(uint)((invert ^ 0xffU) & 1),uVar2,uVar3);
      ExpEmit::Free(&local_40,build);
      break;
    case '\x03':
      uVar2 = (uint)i.RegNum;
      uVar3 = VMFunctionBuilder::GetConstantAddress(build,(void *)0x0,'\0');
      VMFunctionBuilder::Emit(build,0xd0,(uint)((invert ^ 0xffU) & 1),uVar2,uVar3);
    }
    local_50 = VMFunctionBuilder::Emit(build,0x44,0);
    TArray<unsigned_long,_unsigned_long>::Push(patchspots_no,&local_50);
    ExpEmit::Free(&i,build);
    return;
  }
  __assert_fail("op.RegType != REGT_NIL && op.RegCount == 1 && !op.Konst",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x13c,
                "virtual void FxExpression::EmitCompare(VMFunctionBuilder *, bool, TArray<size_t> &, TArray<size_t> &)"
               );
}

Assistant:

void FxExpression::EmitCompare(VMFunctionBuilder *build, bool invert, TArray<size_t> &patchspots_yes, TArray<size_t> &patchspots_no)
{
	ExpEmit op = Emit(build);
	ExpEmit i;
	assert(op.RegType != REGT_NIL && op.RegCount == 1 && !op.Konst);
	switch (op.RegType)
	{
	case REGT_INT:
		build->Emit(OP_EQ_K, !invert, op.RegNum, build->GetConstantInt(0));
		break;

	case REGT_FLOAT:
		build->Emit(OP_EQF_K, !invert, op.RegNum, build->GetConstantFloat(0));
		break;

	case REGT_POINTER:
		build->Emit(OP_EQA_K, !invert, op.RegNum, build->GetConstantAddress(0, ATAG_GENERIC));
		break;

	case REGT_STRING:
		i = ExpEmit(build, REGT_INT);
		build->Emit(OP_LENS, i.RegNum, op.RegNum);
		build->Emit(OP_EQ_K, !invert, i.RegNum, build->GetConstantInt(0));
		i.Free(build);
		break;

	default:
		break;
	}
	patchspots_no.Push(build->Emit(OP_JMP, 0));
	op.Free(build);
}